

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadDataSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  void *local_60;
  void *data;
  Address data_size;
  Enum local_48;
  Enum local_44;
  Enum local_40;
  Index local_3c;
  Enum local_38;
  Index memory_index;
  uint local_30;
  uint32_t flags;
  Index i;
  Enum local_24;
  Offset local_20;
  Offset section_size_local;
  BinaryReader *this_local;
  
  local_20 = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9c])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (bVar1) {
    i = (Index)ReadCount(this,&this->num_data_segments_,"data segment count");
    bVar1 = Failed((Result)i);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      flags = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9d])();
      bVar1 = Succeeded((Result)flags);
      if (bVar1) {
        if ((this->data_count_ == 0xffffffff) || (this->data_count_ == this->num_data_segments_)) {
          for (local_30 = 0; local_30 < this->num_data_segments_; local_30 = local_30 + 1) {
            local_38 = (Enum)ReadU32Leb128(this,&memory_index,"data segment flags");
            bVar1 = Failed((Result)local_38);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            if ((memory_index != 0) &&
               (bVar1 = Features::bulk_memory_enabled(&this->options_->features), !bVar1)) {
              PrintError(this,"invalid memory index %d: bulk memory not allowed",(ulong)memory_index
                        );
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            if (7 < memory_index) {
              PrintError(this,"invalid data segment flags: %#x",(ulong)memory_index);
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            local_3c = 0;
            if ((memory_index & 2) != 0) {
              local_40 = (Enum)ReadIndex(this,&local_3c,"data segment memory index");
              bVar1 = Failed((Result)local_40);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
            local_44 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9e])
                                 (this->delegate_,(ulong)local_30,(ulong)local_3c,
                                  (ulong)(byte)memory_index);
            bVar1 = Succeeded((Result)local_44);
            if (!bVar1) {
              PrintError(this,"BeginDataSegment callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            if ((memory_index & 1) == 0) {
              local_48 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9f])
                                   (this->delegate_,(ulong)local_30);
              bVar1 = Succeeded((Result)local_48);
              if (!bVar1) {
                PrintError(this,"BeginDataSegmentInitExpr callback failed");
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              data_size._4_4_ = ReadInitExpr(this,local_30);
              bVar1 = Failed(data_size._4_4_);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              data_size._0_4_ =
                   (*this->delegate_->_vptr_BinaryReaderDelegate[0xa0])
                             (this->delegate_,(ulong)local_30);
              bVar1 = Succeeded(data_size._0_4_);
              if (!bVar1) {
                PrintError(this,"EndDataSegmentInitExpr callback failed");
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
            RVar2 = ReadBytes(this,&local_60,(Address *)&data,"data segment data");
            bVar1 = Failed(RVar2);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa1])
                                    (this->delegate_,(ulong)local_30,local_60,data);
            bVar1 = Succeeded(RVar2);
            if (!bVar1) {
              PrintError(this,"OnDataSegmentData callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa2])();
            bVar1 = Succeeded(RVar2);
            if (!bVar1) {
              PrintError(this,"EndDataSegment callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa3])();
          bVar1 = Succeeded(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
          else {
            PrintError(this,"EndDataSection callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
        }
        else {
          PrintError(this,"data segment count does not equal count in DataCount section");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnDataSegmentCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginDataSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadDataSection(Offset section_size) {
  CALLBACK(BeginDataSection, section_size);
  CHECK_RESULT(ReadCount(&num_data_segments_, "data segment count"));
  CALLBACK(OnDataSegmentCount, num_data_segments_);
  // If the DataCount section is not present, then data_count_ will be invalid.
  ERROR_UNLESS(
      data_count_ == kInvalidIndex || data_count_ == num_data_segments_,
      "data segment count does not equal count in DataCount section");
  for (Index i = 0; i < num_data_segments_; ++i) {
    uint32_t flags;
    CHECK_RESULT(ReadU32Leb128(&flags, "data segment flags"));
    ERROR_IF(flags != 0 && !options_.features.bulk_memory_enabled(),
             "invalid memory index %d: bulk memory not allowed", flags);
    ERROR_IF(flags > SegFlagMax, "invalid data segment flags: %#x", flags);
    Index memory_index(0);
    if (flags & SegExplicitIndex) {
      CHECK_RESULT(ReadIndex(&memory_index, "data segment memory index"));
    }
    CALLBACK(BeginDataSegment, i, memory_index, flags);
    if (!(flags & SegPassive)) {
      CALLBACK(BeginDataSegmentInitExpr, i);
      CHECK_RESULT(ReadInitExpr(i));
      CALLBACK(EndDataSegmentInitExpr, i);
    }

    Address data_size;
    const void* data;
    CHECK_RESULT(ReadBytes(&data, &data_size, "data segment data"));
    CALLBACK(OnDataSegmentData, i, data, data_size);
    CALLBACK(EndDataSegment, i);
  }
  CALLBACK0(EndDataSection);
  return Result::Ok;
}